

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenRuntimeData.cpp
# Opt level: O3

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionCodeGenRuntimeData::EnsureInlineeCommon
          (FunctionCodeGenRuntimeData *this,Recycler *recycler,ProfileId profiledCallSiteId,
          FunctionBody *inlinee,Type *codeGenRuntimeData)

{
  ushort uVar1;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Recycler *pRVar7;
  WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *pWVar8;
  FunctionCodeGenRuntimeData *pFVar9;
  size_t size;
  undefined1 local_70 [8];
  TrackAllocData data;
  Type inlineeData;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x56,"(recycler)","recycler");
    if (!bVar4) goto LAB_0096f82c;
    *puVar6 = 0;
  }
  if (((this->functionBody).ptr)->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x57,
                                "(profiledCallSiteId < functionBody->GetProfiledCallSiteCount())",
                                "profiledCallSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar4) goto LAB_0096f82c;
    *puVar6 = 0;
  }
  if (inlinee == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/FunctionCodeGenRuntimeData.cpp"
                                ,0x58,"(inlinee)","inlinee");
    if (!bVar4) goto LAB_0096f82c;
    *puVar6 = 0;
  }
  pWVar8 = codeGenRuntimeData->ptr;
  if (pWVar8 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
    data.plusSize = (size_t)((this->functionBody).ptr)->profiledCallSiteCount;
    local_70 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenRuntimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_4aeb28e;
    data.filename._0_4_ = 0x5c;
    pRVar7 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    uVar1 = ((this->functionBody).ptr)->profiledCallSiteCount;
    if (uVar1 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(pRVar7,(TrackAllocData *)0x0);
      pWVar8 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)&DAT_00000008;
    }
    else {
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_0096f82c;
        *puVar6 = 0;
      }
      size = (ulong)uVar1 << 3;
      pWVar8 = (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (pRVar7,size);
      if (pWVar8 == (WriteBarrierPtr<Js::FunctionCodeGenRuntimeData> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_0096f82c:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      memset(pWVar8,0,size);
    }
    Memory::Recycler::WBSetBit((char *)codeGenRuntimeData);
    codeGenRuntimeData->ptr = pWVar8;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(codeGenRuntimeData);
    pWVar8 = codeGenRuntimeData->ptr;
  }
  pFVar9 = pWVar8[profiledCallSiteId].ptr;
  Memory::Recycler::WBSetBit((char *)&data.line);
  data._32_8_ = pFVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&data.line);
  pFVar9 = (FunctionCodeGenRuntimeData *)data._32_8_;
  if (data._32_8_ == 0) {
    local_70 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4aeb28e;
    data.filename._0_4_ = 99;
    pRVar7 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    pFVar9 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar7,0x387914);
    FunctionCodeGenRuntimeData(pFVar9,inlinee);
  }
  else {
    do {
      if ((pFVar9->functionBody).ptr == inlinee) {
        return pFVar9;
      }
      pFVar9 = (pFVar9->next).ptr;
    } while (pFVar9 != (FunctionCodeGenRuntimeData *)0x0);
    local_70 = (undefined1  [8])&typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4aeb28e;
    data.filename._0_4_ = 0x75;
    pRVar7 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
    pFVar9 = (FunctionCodeGenRuntimeData *)new<Memory::Recycler>(0x40,pRVar7,0x387914);
    FunctionCodeGenRuntimeData(pFVar9,inlinee);
    uVar3 = data._32_8_;
    Memory::Recycler::WBSetBit((char *)&pFVar9->next);
    (pFVar9->next).ptr = (FunctionCodeGenRuntimeData *)uVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&pFVar9->next);
  }
  pWVar8 = codeGenRuntimeData->ptr + profiledCallSiteId;
  Memory::Recycler::WBSetBit((char *)pWVar8);
  pWVar8->ptr = pFVar9;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar8);
  return pFVar9;
}

Assistant:

FunctionCodeGenRuntimeData * FunctionCodeGenRuntimeData::EnsureInlineeCommon(
        Recycler *const recycler,
        const ProfileId profiledCallSiteId,
        FunctionBody *const inlinee,
        Field(Field(FunctionCodeGenRuntimeData *)*) & codeGenRuntimeData)
    {
        Assert(recycler);
        Assert(profiledCallSiteId < functionBody->GetProfiledCallSiteCount());
        Assert(inlinee);

        if (codeGenRuntimeData == nullptr)
        {
            codeGenRuntimeData = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenRuntimeData *), functionBody->GetProfiledCallSiteCount());
        }

        Field(FunctionCodeGenRuntimeData *) const inlineeData = codeGenRuntimeData[profiledCallSiteId];

        if (inlineeData == nullptr)
        {
            FunctionCodeGenRuntimeData * runtimeData = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
            codeGenRuntimeData[profiledCallSiteId] = runtimeData;
            return runtimeData;
        }

        // Find the right code gen runtime data
        FunctionCodeGenRuntimeData * next = inlineeData;

        while (next && (next->GetFunctionBody() != inlinee))
        {
            next = next->GetNext();
        }

        if (next)
        {
            return next;
        }

        FunctionCodeGenRuntimeData * runtimeData = RecyclerNew(recycler, FunctionCodeGenRuntimeData, inlinee);
        runtimeData->SetupRuntimeDataChain(inlineeData);
        codeGenRuntimeData[profiledCallSiteId] = runtimeData;
        return runtimeData;
    }